

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void clean_specs(parser_hook *h)

{
  parser_spec *p;
  parser_spec *s;
  parser_hook *h_local;
  
  mem_free(h->dir);
  while (h->fhead != (parser_spec *)0x0) {
    p = h->fhead;
    h->fhead = h->fhead->next;
    mem_free(p->name);
    mem_free(p);
  }
  return;
}

Assistant:

static void clean_specs(struct parser_hook *h) {
	struct parser_spec *s;
	mem_free(h->dir);
	while (h->fhead) {
		s = h->fhead;
		h->fhead = h->fhead->next;
		mem_free((void*)s->name);
		mem_free(s);
	}
}